

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
destruct_value(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *this)

{
  std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
  ::~vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
             *)(this + 0x48));
  if (*(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)(this + 0x20) != this + 0x30
     ) {
    operator_delete(*(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)(this + 0x20),
                    *(long *)(this + 0x30) + 1);
  }
  if (*(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)this,
                    *(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }